

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QSqlField>::emplace<QSqlField_const&>
          (QMovableArrayOps<QSqlField> *this,qsizetype i,QSqlField *args)

{
  QSqlField **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QSqlField *pQVar4;
  QSqlField *pQVar5;
  QSqlFieldPrivate *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QSqlField tmp;
  Inserter local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  QSqlFieldPrivate *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00126091:
    local_38 = (QSqlFieldPrivate *)0xaaaaaaaaaaaaaaaa;
    local_58._16_8_ = 0xaaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
    QSqlField::QSqlField((QSqlField *)&local_58,args);
    bVar7 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size != 0;
    QArrayDataPointer<QSqlField>::detachAndGrow
              ((QArrayDataPointer<QSqlField> *)this,(uint)(i == 0 && bVar7),1,(QSqlField **)0x0,
               (QArrayDataPointer<QSqlField> *)0x0);
    pQVar6 = local_38;
    if (i == 0 && bVar7) {
      pQVar4 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
      *(undefined8 *)((long)&pQVar4[-1].val.d.data + 0x10) = local_58._16_8_;
      *(undefined8 *)&pQVar4[-1].val.d.field_0x18 = uStack_40;
      pQVar4[-1].val.d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar4[-1].val.d.data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      uStack_40 = 2;
      local_38 = (QSqlFieldPrivate *)0x0;
      pQVar4[-1].d.d.ptr = pQVar6;
      ppQVar1 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
      pQVar4 = pQVar5 + i + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size - i) *
           0x28;
      local_80.data = (QArrayDataPointer<QSqlField> *)this;
      local_80.displaceTo = pQVar4;
      memmove(pQVar4,pQVar5 + i,local_80.bytes);
      pQVar6 = local_38;
      *(undefined8 *)((long)&pQVar4[-1].val.d.data + 0x10) = local_58._16_8_;
      *(undefined8 *)&pQVar4[-1].val.d.field_0x18 = uStack_40;
      pQVar4[-1].val.d.data.shared = local_58.shared;
      *(undefined8 *)((long)&pQVar4[-1].val.d.data + 8) = local_58._8_8_;
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      uStack_40 = 2;
      local_38 = (QSqlFieldPrivate *)0x0;
      pQVar4[-1].d.d.ptr = pQVar6;
      local_80.displaceFrom = pQVar4;
      Inserter::~Inserter(&local_80);
    }
    QSqlField::~QSqlField((QSqlField *)&local_58);
  }
  else {
    if (((this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      QSqlField::QSqlField(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr,
         (QSqlField *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar4)) goto LAB_00126091;
      QSqlField::QSqlField(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QSqlField>).super_QArrayDataPointer<QSqlField>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }